

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageIO.cpp
# Opt level: O2

void Imf_2_5::loadFlatImage(string *fileName,Header *hdr,FlatImage *img)

{
  bool bVar1;
  ostream *poVar2;
  ArgExc *pAVar3;
  bool multiPart;
  bool deep;
  bool tiled;
  stringstream _iex_throw_s;
  ostream local_190 [376];
  
  bVar1 = isOpenExrFile((fileName->_M_dataplus)._M_p,&tiled,&deep,&multiPart);
  if (!bVar1) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar2 = std::operator<<(local_190,"Cannot load image file ");
    poVar2 = std::operator<<(poVar2,(string *)fileName);
    std::operator<<(poVar2,".  The file is not an OpenEXR file.");
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar3,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar3,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  if (multiPart != true) {
    if (deep != true) {
      if (tiled == true) {
        loadFlatTiledImage(fileName,hdr,img);
      }
      else {
        loadFlatScanLineImage(fileName,hdr,img);
      }
      return;
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar2 = std::operator<<(local_190,"Cannot load deep image file ");
    poVar2 = std::operator<<(poVar2,(string *)fileName);
    std::operator<<(poVar2," as a flat image.");
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar3,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar3,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar2 = std::operator<<(local_190,"Cannot load image file ");
  poVar2 = std::operator<<(poVar2,(string *)fileName);
  std::operator<<(poVar2,".  Multi-part file loading is not supported.");
  pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(pAVar3,(stringstream *)&_iex_throw_s);
  __cxa_throw(pAVar3,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
loadFlatImage
    (const string &fileName,
     Header &hdr,
     FlatImage &img)
{
    bool tiled, deep, multiPart;

    if (!isOpenExrFile (fileName.c_str(), tiled, deep, multiPart))
    {
        THROW (ArgExc, "Cannot load image file " << fileName << ".  "
                       "The file is not an OpenEXR file.");
    }

    if (multiPart)
    {
        THROW (ArgExc, "Cannot load image file " << fileName << ".  "
                       "Multi-part file loading is not supported.");
    }

    if (deep)
    {
        THROW (ArgExc, "Cannot load deep image file " << fileName << " "
                       "as a flat image.");
    }

    if (tiled)
        loadFlatTiledImage (fileName, hdr, img);
    else
        loadFlatScanLineImage (fileName, hdr, img);
}